

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void deferred_ping(void *arg,void *arg2)

{
  fio_defer_task_s task;
  fio_protocol_s *pfVar1;
  long lVar2;
  ulong uVar3;
  long fd;
  fio_lock_i ret;
  
  fd = (long)(int)((ulong)arg >> 8);
  lVar2 = fd * 0xa8;
  if (*(long *)((long)fio_data + lVar2 + 0x58) != 0) {
    uVar3 = (ulong)*(byte *)((long)fio_data + lVar2 + 0x6a);
    if ((uVar3 == 0) ||
       ((long)(uVar3 + *(long *)((long)fio_data + lVar2 + 0x60)) <= (fio_data->last_cycle).tv_sec))
    {
      pfVar1 = protocol_try_lock(fd,FIO_PR_LOCK_WRITE);
      if (pfVar1 == (fio_protocol_s *)0x0) {
        task.arg1 = arg;
        task.func = deferred_ping;
        task.arg2 = (void *)0x0;
        fio_defer_push_task_fn(task,&task_queue_normal);
      }
      else {
        (*pfVar1->ping)((intptr_t)arg,pfVar1);
        LOCK();
        *(undefined1 *)((long)&pfVar1->rsv + 1) = 0;
        UNLOCK();
      }
    }
  }
  return;
}

Assistant:

static void deferred_ping(void *arg, void *arg2) {
  if (!uuid_data(arg).protocol ||
      (uuid_data(arg).timeout &&
       (uuid_data(arg).timeout + uuid_data(arg).active >
        (fio_data->last_cycle.tv_sec)))) {
    return;
  }
  fio_protocol_s *pr = protocol_try_lock(fio_uuid2fd(arg), FIO_PR_LOCK_WRITE);
  if (!pr)
    goto postpone;
  pr->ping((intptr_t)arg, pr);
  protocol_unlock(pr, FIO_PR_LOCK_WRITE);
  return;
postpone:
  fio_defer_push_task(deferred_ping, arg, NULL);
  (void)arg2;
}